

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

ProgressData * __thiscall
duckdb::PhysicalHashAggregate::GetProgress
          (ProgressData *__return_storage_ptr__,PhysicalHashAggregate *this,ClientContext *context,
          GlobalSourceState *gstate_p)

{
  uint uVar1;
  pointer pGVar2;
  const_reference this_00;
  reference this_01;
  type sink_p;
  reference this_02;
  type gstate_p_00;
  size_type __n;
  uint uVar3;
  double dVar4;
  double dVar5;
  ProgressData local_48;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  if ((this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    dVar5 = 0.0;
    uVar3 = 0;
    __n = 0;
    do {
      this_00 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](&this->groupings,__n);
      this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar2 + 1),
                           __n);
      sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator*(&this_01->table_state);
      this_02 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                              *)&gstate_p[1].super_StateWithBlockableTasks.lock,__n);
      gstate_p_00 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                    ::operator*(this_02);
      RadixPartitionedHashTable::GetProgress
                (&local_48,&this_00->table_data,context,sink_p,gstate_p_00);
      uVar1 = uVar3 & 1;
      uVar3 = 1;
      if (uVar1 == 0) {
        uVar3 = local_48._16_4_;
      }
      dVar4 = dVar4 + local_48.done;
      dVar5 = dVar5 + local_48.total;
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          0x6db6db6db6db6db7));
    __return_storage_ptr__->total = dVar5;
    __return_storage_ptr__->invalid = SUB41(uVar3,0);
  }
  __return_storage_ptr__->done = dVar4;
  return __return_storage_ptr__;
}

Assistant:

ProgressData PhysicalHashAggregate::GetProgress(ClientContext &context, GlobalSourceState &gstate_p) const {
	auto &sink_gstate = sink_state->Cast<HashAggregateGlobalSinkState>();
	auto &gstate = gstate_p.Cast<HashAggregateGlobalSourceState>();
	ProgressData progress;
	for (idx_t radix_idx = 0; radix_idx < groupings.size(); radix_idx++) {
		progress.Add(groupings[radix_idx].table_data.GetProgress(
		    context, *sink_gstate.grouping_states[radix_idx].table_state, *gstate.radix_states[radix_idx]));
	}
	return progress;
}